

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

bool __thiscall
Clasp::Cli::ClaspCliConfig::setConfig
          (ClaspCliConfig *this,ConfigIter *config,uint8 mode,uint32 sId,ParsedOpts *exclude,
          ParsedOpts *out)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  ConfigIter __s;
  size_t sVar4;
  char *pcVar5;
  ConfigKey baseK;
  ConfigKey local_3c;
  ParsedOpts *local_38;
  
  pcVar1 = config->base_;
  sVar3 = strlen(pcVar1);
  if (pcVar1[sVar3 + 2] != '\0') {
    local_3c = config_default;
    local_38 = exclude;
    sVar3 = strlen(pcVar1);
    bVar2 = Potassco::string_cast<Clasp::Cli::ConfigKey>(pcVar1 + sVar3 + 2,&local_3c);
    if (!bVar2) {
      pcVar1 = config->base_;
      pcVar5 = ConfigIter::base(config);
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setConfig(const ConfigIter &, uint8, uint32, const ParsedOpts &, ParsedOpts *)"
                     ,0x457,"Potassco::stringTo(config.base(), baseK)",
                     "%s: \'%s\': Invalid base config!",pcVar1 + 1,pcVar5,0);
    }
    __s = getConfig(local_3c);
    sVar3 = strlen(__s.base_);
    sVar4 = strlen(__s.base_ + sVar3 + 2);
    exclude = local_38;
    setConfig(this,__s.base_ + 1,__s.base_ + sVar4 + sVar3 + 4,mode | 1,sId,local_38,out);
  }
  pcVar1 = config->base_;
  sVar3 = strlen(pcVar1);
  sVar4 = strlen(pcVar1 + sVar3 + 2);
  setConfig(this,pcVar1 + 1,pcVar1 + sVar4 + sVar3 + 4,mode,sId,exclude,out);
  return true;
}

Assistant:

bool ClaspCliConfig::setConfig(const ConfigIter& config, uint8 mode, uint32 sId, const ParsedOpts& exclude, ParsedOpts* out) {
	if (*config.base()) {
		ConfigKey baseK = config_default;
		POTASSCO_REQUIRE(Potassco::stringTo(config.base(), baseK), "%s: '%s': Invalid base config!", config.name(), config.base());
		ConfigIter base = getConfig(baseK);
		if (!setConfig(base.name(), base.args(), mode | mode_solver, sId, exclude, out)) {
			return false;
		}
	}
	return setConfig(config.name(), config.args(), mode, sId, exclude, out);
}